

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparators.cpp
# Opt level: O3

int duckdb::Comparators::TemplatedCompareVal<duckdb::interval_t>
              (data_ptr_t *left_ptr,data_ptr_t *right_ptr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  uVar1 = *(ulong *)*left_ptr;
  uVar2 = *(ulong *)((long)*left_ptr + 8);
  uVar3 = *(ulong *)*right_ptr;
  uVar4 = *(ulong *)((long)*right_ptr + 8);
  iVar5 = (int)uVar3;
  iVar8 = (int)(uVar3 >> 0x20);
  if ((uVar1 >> 0x20 != uVar3 >> 0x20 || (int)uVar1 != iVar5) ||
     (iVar8 = (int)(uVar1 >> 0x20), uVar2 != uVar4)) {
    lVar6 = ((long)uVar1 >> 0x20) + (long)uVar2 / 86400000000;
    lVar10 = lVar6 % 0x1e;
    lVar9 = (long)iVar8 + (long)uVar4 / 86400000000;
    lVar6 = (long)(int)uVar1 + lVar6 / 0x1e;
    if ((lVar6 != lVar9 / 0x1e + (long)iVar5) ||
       ((lVar10 != lVar9 % 0x1e || ((long)uVar2 % 86400000000 != (long)uVar4 % 86400000000)))) {
      lVar9 = (long)uVar4 / 86400000000 + ((long)uVar3 >> 0x20);
      lVar7 = lVar9 % 0x1e;
      lVar9 = lVar9 / 0x1e + (long)iVar5;
      if (lVar9 <= lVar6) {
        if (lVar9 < lVar6) {
          return 1;
        }
        if ((lVar7 <= lVar10) &&
           ((long)uVar4 % 86400000000 <= (long)uVar2 % 86400000000 || lVar7 < lVar10)) {
          return 1;
        }
      }
      return -1;
    }
  }
  return 0;
}

Assistant:

int Comparators::TemplatedCompareVal(const data_ptr_t &left_ptr, const data_ptr_t &right_ptr) {
	const auto left_val = Load<T>(left_ptr);
	const auto right_val = Load<T>(right_ptr);
	if (Equals::Operation<T>(left_val, right_val)) {
		return 0;
	} else if (LessThan::Operation<T>(left_val, right_val)) {
		return -1;
	} else {
		return 1;
	}
}